

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmainct.c
# Opt level: O1

void start_pass_main(j_decompress_ptr cinfo,J_BUF_MODE pass_mode)

{
  int iVar1;
  int iVar2;
  jpeg_d_main_controller *pjVar3;
  undefined8 *puVar4;
  _func_void_j_decompress_ptr_J_BUF_MODE *p_Var5;
  undefined8 uVar6;
  jpeg_error_mgr *pjVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  jpeg_component_info *pjVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pjVar3 = cinfo->main;
  if (pass_mode == JBUF_CRANK_DEST) {
    pjVar3->process_data = process_data_crank_post;
    return;
  }
  if (pass_mode == JBUF_PASS_THRU) {
    if (cinfo->upsample->need_context_rows == 0) {
      pjVar3->process_data = process_data_simple_main;
    }
    else {
      pjVar3->process_data = process_data_context_main;
      auVar9 = _DAT_00158050;
      auVar8 = _DAT_00158000;
      iVar1 = cinfo->num_components;
      if (0 < (long)iVar1) {
        iVar2 = cinfo->min_DCT_scaled_size;
        pjVar15 = cinfo->comp_info;
        lVar16 = 0;
        do {
          uVar13 = (long)(pjVar15->DCT_scaled_size * pjVar15->v_samp_factor) / (long)iVar2;
          puVar4 = *(undefined8 **)(pjVar3[6].process_data + lVar16 * 8);
          lVar17 = *(long *)(pjVar3[7].start_pass + lVar16 * 8);
          p_Var5 = (&pjVar3[1].start_pass)[lVar16];
          iVar10 = (int)uVar13;
          uVar11 = iVar10 * (iVar2 + 2);
          if (0 < (int)uVar11) {
            uVar12 = 0;
            do {
              uVar6 = *(undefined8 *)(p_Var5 + uVar12 * 8);
              *(undefined8 *)(lVar17 + uVar12 * 8) = uVar6;
              puVar4[uVar12] = uVar6;
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
          }
          if (0 < iVar10) {
            lVar14 = (long)(iVar10 * (iVar2 + -2));
            uVar11 = iVar10 * 2;
            if (iVar10 * 2 < 2) {
              uVar11 = 1;
            }
            uVar12 = 0;
            do {
              *(undefined8 *)(lVar17 + lVar14 * 8 + uVar12 * 8) =
                   *(undefined8 *)(p_Var5 + uVar12 * 8 + (long)(iVar10 * iVar2) * 8);
              *(undefined8 *)(lVar17 + (long)(iVar10 * iVar2) * 8 + uVar12 * 8) =
                   *(undefined8 *)(p_Var5 + uVar12 * 8 + lVar14 * 8);
              uVar12 = uVar12 + 1;
            } while (uVar11 != uVar12);
            if (0 < iVar10) {
              uVar13 = uVar13 & 0xffffffff;
              lVar17 = uVar13 - 1;
              auVar18._8_4_ = (int)lVar17;
              auVar18._0_8_ = lVar17;
              auVar18._12_4_ = (int)((ulong)lVar17 >> 0x20);
              auVar18 = auVar18 ^ auVar9;
              lVar17 = 0;
              auVar19 = auVar8;
              do {
                auVar20 = auVar19 ^ auVar9;
                uVar6 = *puVar4;
                if ((bool)(~(auVar18._4_4_ < auVar20._4_4_ ||
                            auVar18._0_4_ < auVar20._0_4_ && auVar20._4_4_ == auVar18._4_4_) & 1)) {
                  *(undefined8 *)((long)puVar4 + lVar17 + uVar13 * -8) = uVar6;
                }
                if (auVar20._12_4_ <= auVar18._12_4_ &&
                    (auVar20._8_4_ <= auVar18._8_4_ || auVar20._12_4_ != auVar18._12_4_)) {
                  *(undefined8 *)((long)puVar4 + lVar17 + uVar13 * -8 + 8) = uVar6;
                }
                lVar14 = auVar19._8_8_;
                auVar19._0_8_ = auVar19._0_8_ + 2;
                auVar19._8_8_ = lVar14 + 2;
                lVar17 = lVar17 + 0x10;
              } while ((ulong)(iVar10 + 1U >> 1) << 4 != lVar17);
            }
          }
          lVar16 = lVar16 + 1;
          pjVar15 = pjVar15 + 1;
        } while (lVar16 != iVar1);
      }
      pjVar3[7].process_data =
           (_func_void_j_decompress_ptr_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION *)0x0;
      *(undefined4 *)((long)&pjVar3[8].start_pass + 4) = 0;
    }
    pjVar3[6].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
    return;
  }
  pjVar7 = cinfo->err;
  pjVar7->msg_code = 4;
  (*pjVar7->error_exit)((j_common_ptr)cinfo);
  return;
}

Assistant:

METHODDEF(void)
start_pass_main(j_decompress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  switch (pass_mode) {
  case JBUF_PASS_THRU:
    if (cinfo->upsample->need_context_rows) {
      main_ptr->pub.process_data = process_data_context_main;
      make_funny_pointers(cinfo); /* Create the xbuffer[] lists */
      main_ptr->whichptr = 0;   /* Read first iMCU row into xbuffer[0] */
      main_ptr->context_state = CTX_PREPARE_FOR_IMCU;
      main_ptr->iMCU_row_ctr = 0;
    } else {
      /* Simple case with no context needed */
      main_ptr->pub.process_data = process_data_simple_main;
    }
    main_ptr->buffer_full = FALSE;      /* Mark buffer empty */
    main_ptr->rowgroup_ctr = 0;
    break;
#ifdef QUANT_2PASS_SUPPORTED
  case JBUF_CRANK_DEST:
    /* For last pass of 2-pass quantization, just crank the postprocessor */
    main_ptr->pub.process_data = process_data_crank_post;
    break;
#endif
  default:
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
    break;
  }
}